

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool duckdb_je_arena_ralloc_no_move
                (tsdn_t *tsdn,void *ptr,size_t oldsize,size_t size,size_t extra,_Bool zero,
                size_t *newsize)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  int iVar5;
  arena_t *arena;
  ulong uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  uint uVar9;
  szind_t sVar10;
  ulong uVar11;
  size_t usize_min;
  ulong uVar12;
  long lVar13;
  rtree_leaf_elm_t *prVar14;
  edata_t *edata;
  rtree_ctx_t *ctx;
  size_t usize_max;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar11 = (ulong)ptr & 0xffffffffc0000000;
  uVar12 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  uVar12 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  if (uVar12 == uVar11) {
    prVar14 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar11) {
    prVar14 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar12;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar11;
    puVar1[1] = (ulong)prVar14;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar14->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    lVar13 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar13 + -8) == uVar11) {
        uVar6 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar13);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar13 + -0x18);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar13 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        *(ulong *)((long)ctx->cache + lVar13 + -0x18) = uVar12;
        *(ulong *)((long)(ctx->cache + -1) + lVar13) = puVar1[1];
        *puVar1 = uVar11;
        puVar1[1] = uVar6;
        prVar14 = (rtree_leaf_elm_t *)(((uint)ptr >> 9 & 0x1ffff8) + uVar6);
        goto LAB_00cddaed;
      }
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x188);
    prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                        (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_00cddaed:
  edata = (edata_t *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  _Var8 = true;
  if (0x7000000000000000 < size) goto LAB_00cddc1e;
  if (size < 0x1001) {
    usize_min = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
  }
  else {
    uVar12 = size * 2 - 1;
    lVar13 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    uVar12 = -1L << (0x3c - ((byte)lVar13 ^ 0x3f) & 0x3f);
    usize_min = ~uVar12 + size & uVar12;
  }
  uVar12 = extra + size;
  if (uVar12 < 0x1001) {
    usize_max = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar12 + 7 >> 3]];
LAB_00cddb77:
    if ((0x3800 < oldsize) || (0x3800 < usize_min)) {
      if ((0x3fff < oldsize) && (0x3fff < usize_max)) {
        _Var8 = duckdb_je_large_ralloc_no_move(tsdn,edata,usize_min,usize_max,zero);
      }
      goto LAB_00cddc1e;
    }
    if (usize_max < 0x3801) {
      if (usize_max < 0x1001) goto LAB_00cddba7;
      sVar10 = sz_size2index_compute(usize_max);
      goto LAB_00cddbba;
    }
LAB_00cddbde:
    _Var8 = true;
    if ((oldsize < size) || (usize_max < oldsize)) goto LAB_00cddc1e;
  }
  else {
    if (uVar12 < 0x7000000000000001) {
      uVar11 = uVar12 * 2 - 1;
      lVar13 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      uVar11 = -1L << (0x3c - ((byte)lVar13 ^ 0x3f) & 0x3f);
      usize_max = ~uVar11 + uVar12 & uVar11;
      goto LAB_00cddb77;
    }
    if ((0x3800 < oldsize) || (0x3800 < usize_min)) {
      _Var8 = true;
      goto LAB_00cddc1e;
    }
    usize_max = 0;
LAB_00cddba7:
    sVar10 = (szind_t)duckdb_je_sz_size2index_tab[usize_max + 7 >> 3];
LAB_00cddbba:
    if (oldsize < 0x1001) {
      uVar9 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar9 = sz_size2index_compute(oldsize);
    }
    if (sVar10 != uVar9) goto LAB_00cddbde;
  }
  arena = (arena_t *)duckdb_je_arenas[(uint)edata->e_bits & 0xfff].repr;
  if (tsdn != (tsdn_t *)0x0) {
    cVar4 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar5 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar5 + -1;
    if (iVar5 < 1) {
      if (cVar4 < '\x01') {
        uVar12 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar12;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar12 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
        _Var8 = false;
        goto LAB_00cddc1e;
      }
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick = 0;
    }
  }
  _Var8 = false;
LAB_00cddc1e:
  *newsize = *(size_t *)
              ((long)duckdb_je_sz_index2size_tab + (ulong)((uint)edata->e_bits >> 0x11 & 0x7f8));
  return _Var8;
}

Assistant:

bool
arena_ralloc_no_move(tsdn_t *tsdn, void *ptr, size_t oldsize, size_t size,
    size_t extra, bool zero, size_t *newsize) {
	bool ret;
	/* Calls with non-zero extra had to clamp extra. */
	assert(extra == 0 || size + extra <= SC_LARGE_MAXCLASS);

	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto done;
	}

	size_t usize_min = sz_s2u(size);
	size_t usize_max = sz_s2u(size + extra);
	if (likely(oldsize <= SC_SMALL_MAXCLASS && usize_min
	    <= SC_SMALL_MAXCLASS)) {
		/*
		 * Avoid moving the allocation if the size class can be left the
		 * same.
		 */
		assert(bin_infos[sz_size2index(oldsize)].reg_size ==
		    oldsize);
		if ((usize_max > SC_SMALL_MAXCLASS
		    || sz_size2index(usize_max) != sz_size2index(oldsize))
		    && (size > oldsize || usize_max < oldsize)) {
			ret = true;
			goto done;
		}

		arena_t *arena = arena_get_from_edata(edata);
		arena_decay_tick(tsdn, arena);
		ret = false;
	} else if (oldsize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS) {
		ret = large_ralloc_no_move(tsdn, edata, usize_min, usize_max,
		    zero);
	} else {
		ret = true;
	}
done:
	assert(edata == emap_edata_lookup(tsdn, &arena_emap_global, ptr));
	*newsize = edata_usize_get(edata);

	return ret;
}